

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Identity.pb.cc
# Opt level: O3

Identity * __thiscall CoreML::Specification::Identity::New(Identity *this,Arena *arena)

{
  Identity *this_00;
  
  this_00 = (Identity *)operator_new(0x18);
  Identity(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::Identity>(arena,this_00);
  }
  return this_00;
}

Assistant:

Identity* Identity::New(::google::protobuf::Arena* arena) const {
  Identity* n = new Identity;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}